

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::set_custom_data
          (task_impl_base<_1a67ba37_> *this,shared_ptr<void> *custom_data)

{
  node *node;
  invalid_parameter *this_00;
  string local_50;
  shared_ptr<void> local_30;
  
  ensure_task_not_running(this);
  local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (custom_data->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    node = (this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (custom_data->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (custom_data->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (custom_data->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
    ;
    node_manip::set_custom_data(node,&local_30);
    if (local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    return;
  }
  this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"custom data pointer","");
  invalid_parameter::invalid_parameter(this_00,&local_50);
  __cxa_throw(this_00,&invalid_parameter::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_custom_data(std::shared_ptr<void> custom_data) override {
        ensure_task_not_running();
        if (!custom_data) {
            throw transwarp::invalid_parameter("custom data pointer");
        }
        transwarp::detail::node_manip::set_custom_data(*node_, std::move(custom_data));
    }